

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_2892ed::ArgParser::argEncBits(ArgParser *this,string *arg)

{
  bool bVar1;
  element_type *__block;
  shared_ptr<QPDFJob::EncConfig> local_100;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  int local_50;
  int keylen;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *arg_local;
  ArgParser *this_local;
  
  local_18 = arg;
  arg_local = (string *)this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->accumulated_args);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"positional and dashed encryption arguments may not be mixed",
               &local_39);
    usage(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  local_50 = 0;
  bVar1 = std::operator==(local_18,"40");
  if (bVar1) {
    local_50 = 0x28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"40-bit encryption",&local_71);
    QPDFArgParser::selectOptionTable(&this->ap,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  else {
    bVar1 = std::operator==(local_18,"128");
    if (bVar1) {
      local_50 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"128-bit encryption",&local_99);
      QPDFArgParser::selectOptionTable(&this->ap,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
    }
    else {
      bVar1 = std::operator==(local_18,"256");
      if (bVar1) {
        local_50 = 0x100;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"256-bit encryption",&local_c1);
        QPDFArgParser::selectOptionTable(&this->ap,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"encryption key length must be 40, 128, or 256",&local_e9);
        usage(this,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator(&local_e9);
      }
    }
  }
  __block = std::__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->c_main);
  QPDFJob::Config::encrypt((Config *)&local_100,(char *)__block,local_50);
  std::shared_ptr<QPDFJob::EncConfig>::operator=(&this->c_enc,&local_100);
  std::shared_ptr<QPDFJob::EncConfig>::~shared_ptr(&local_100);
  return;
}

Assistant:

void
ArgParser::argEncBits(std::string const& arg)
{
    if (!accumulated_args.empty()) {
        usage("positional and dashed encryption arguments may not be mixed");
    }
    int keylen = 0;
    if (arg == "40") {
        keylen = 40;
        this->ap.selectOptionTable(O_40_BIT_ENCRYPTION);
    } else if (arg == "128") {
        keylen = 128;
        this->ap.selectOptionTable(O_128_BIT_ENCRYPTION);
    } else if (arg == "256") {
        keylen = 256;
        this->ap.selectOptionTable(O_256_BIT_ENCRYPTION);
    } else {
        usage("encryption key length must be 40, 128, or 256");
    }
    this->c_enc = c_main->encrypt(keylen, user_password, owner_password);
}